

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

void __thiscall
helics::ValueFederate::setInputNotificationCallback
          (ValueFederate *this,Input *inp,
          function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *callback)

{
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  ValueFederateManager::setInputNotificationCallback
            (inp,(function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *)
                 &local_28);
  if (local_18 != (_Manager_type)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void ValueFederate::setInputNotificationCallback(Input& inp,
                                                 std::function<void(Input&, Time)> callback)
{
    vfManager->setInputNotificationCallback(inp, std::move(callback));
}